

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O0

void __thiscall
xmrig::FailoverStrategy::onClose(FailoverStrategy *this,IClient *client,int failures)

{
  long lVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference ppIVar5;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  
  if (in_EDX != -1) {
    iVar3 = *(int *)(in_RDI + 0x1c);
    iVar2 = (**(code **)(*in_RSI + 0x60))();
    if (iVar3 == iVar2) {
      *(undefined4 *)(in_RDI + 0x1c) = 0xffffffff;
      (**(code **)(**(long **)(in_RDI + 0x20) + 0x28))();
    }
    if ((((*(long *)(in_RDI + 0x28) != 0) || (*(int *)(in_RDI + 0x14) <= in_EDX)) &&
        (lVar1 = *(long *)(in_RDI + 0x28), iVar3 = (**(code **)(*in_RSI + 0x60))(), lVar1 == iVar3))
       && (sVar4 = std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::size
                             ((vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *)
                              (in_RDI + 0x30)), 1 < sVar4 - *(long *)(in_RDI + 0x28))) {
      sVar4 = *(long *)(in_RDI + 0x28) + 1;
      *(size_type *)(in_RDI + 0x28) = sVar4;
      ppIVar5 = std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::operator[]
                          ((vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *)
                           (in_RDI + 0x30),sVar4);
      (*(*ppIVar5)->_vptr_IClient[0x11])();
    }
  }
  return;
}

Assistant:

void xmrig::FailoverStrategy::onClose(IClient *client, int failures)
{
    if (failures == -1) {
        return;
    }

    if (m_active == client->id()) {
        m_active = -1;
        m_listener->onPause(this);
    }

    if (m_index == 0 && failures < m_retries) {
        return;
    }

    if (m_index == static_cast<size_t>(client->id()) && (m_pools.size() - m_index) > 1) {
        m_pools[++m_index]->connect();
    }
}